

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O1

void __thiscall
Messages::Person_PhoneNumber::InternalSwap(Person_PhoneNumber *this,Person_PhoneNumber *other)

{
  undefined1 *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  uint32 uVar1;
  int iVar2;
  string *psVar3;
  UnknownFieldSet *other_00;
  Arena *arena;
  
  this_00 = &other->field_0x8;
  if (((this->field_0x8 & 1) != 0) || ((*this_00 & 1) != 0)) {
    if ((*(ulong *)this_00 & 1) == 0) {
      other_00 = google::protobuf::internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                           ((InternalMetadata *)this_00);
    }
    else {
      other_00 = (UnknownFieldSet *)((*(ulong *)this_00 & 0xfffffffffffffffe) + 8);
    }
    google::protobuf::internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8,other_00);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  this_01 = &this->number_;
  arena = *(Arena **)&this->field_0x8;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  this_02 = &other->number_;
  if (this_01->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
  {
    if (this_02->ptr_ ==
        (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_0010872a;
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (this_01,arena,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar3 = this_01->ptr_;
  if (this_02->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
  {
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (this_02,arena,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar3);
LAB_0010872a:
  iVar2 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar2;
  return;
}

Assistant:

void Person_PhoneNumber::InternalSwap(Person_PhoneNumber* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  number_.Swap(&other->number_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(type_, other->type_);
}